

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynNamespaceDefinition * ParseNamespaceDefinition(ParseContext *ctx)

{
  Lexeme *begin;
  SynNamespaceElement *pSVar1;
  IntrusiveList<SynIdentifier> path_00;
  bool bVar2;
  SynIdentifier *pSVar3;
  Lexeme *pLVar4;
  Lexeme *pLVar5;
  InplaceStr IVar6;
  IntrusiveList<SynBase> expressions;
  IntrusiveList<SynBase> code;
  SynIdentifier *el;
  SynNamespaceElement *currentNamespace;
  InplaceStr value_1;
  InplaceStr value;
  IntrusiveList<SynIdentifier> path;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar2 = ParseContext::Consume(ctx,lex_namespace);
  if (bVar2) {
    IntrusiveList<SynIdentifier>::IntrusiveList((IntrusiveList<SynIdentifier> *)&value.end);
    bVar2 = anon_unknown.dwarf_fc7e::CheckAt(ctx,lex_string,"ERROR: namespace name required");
    if (bVar2) {
      IVar6 = ParseContext::Consume(ctx);
      pSVar3 = ParseContext::get<SynIdentifier>(ctx);
      pLVar5 = ParseContext::Previous(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(pSVar3,pLVar5,pLVar4,IVar6);
      IntrusiveList<SynIdentifier>::push_back((IntrusiveList<SynIdentifier> *)&value.end,pSVar3);
    }
    while ((bVar2 = ParseContext::Consume(ctx,lex_point), bVar2 &&
           (bVar2 = anon_unknown.dwarf_fc7e::CheckAt
                              (ctx,lex_string,"ERROR: namespace name required after \'.\'"), bVar2))
          ) {
      IVar6 = ParseContext::Consume(ctx);
      pSVar3 = ParseContext::get<SynIdentifier>(ctx);
      pLVar5 = ParseContext::Previous(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(pSVar3,pLVar5,pLVar4,IVar6);
      IntrusiveList<SynIdentifier>::push_back((IntrusiveList<SynIdentifier> *)&value.end,pSVar3);
    }
    anon_unknown.dwarf_fc7e::CheckConsume
              (ctx,lex_ofigure,"ERROR: \'{\' not found after namespace name");
    pSVar1 = ctx->currentNamespace;
    for (code.tail = (SynBase *)value.end; code.tail != (SynBase *)0x0;
        code.tail = (code.tail)->next) {
      ParseContext::PushNamespace(ctx,(SynIdentifier *)code.tail);
    }
    expressions = ParseExpressions(ctx);
    ctx->currentNamespace = pSVar1;
    anon_unknown.dwarf_fc7e::CheckConsume
              (ctx,lex_cfigure,"ERROR: \'}\' not found after namespace body");
    ctx_local = (ParseContext *)ParseContext::get<SynNamespaceDefinition>(ctx);
    pLVar5 = ParseContext::Previous(ctx);
    path_00.tail = path.head;
    path_00.head = (SynIdentifier *)value.end;
    SynNamespaceDefinition::SynNamespaceDefinition
              ((SynNamespaceDefinition *)ctx_local,begin,pLVar5,path_00,expressions);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynNamespaceDefinition *)ctx_local;
}

Assistant:

SynNamespaceDefinition* ParseNamespaceDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_namespace))
	{
		IntrusiveList<SynIdentifier> path;

		if(CheckAt(ctx, lex_string, "ERROR: namespace name required"))
		{
			InplaceStr value = ctx.Consume();
			path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
		}

		while(ctx.Consume(lex_point))
		{
			if(!CheckAt(ctx, lex_string, "ERROR: namespace name required after '.'"))
				break;

			InplaceStr value = ctx.Consume();
			path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
		}

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after namespace name");

		SynNamespaceElement *currentNamespace = ctx.currentNamespace;

		for(SynIdentifier *el = path.head; el; el = (SynIdentifier*)el->next)
			ctx.PushNamespace(el);

		IntrusiveList<SynBase> code = ParseExpressions(ctx);

		ctx.currentNamespace = currentNamespace;

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after namespace body");

		return new (ctx.get<SynNamespaceDefinition>()) SynNamespaceDefinition(start, ctx.Previous(), path, code);
	}

	return NULL;
}